

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_metric.hpp
# Opt level: O0

void __thiscall
ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x00'>::clean_expired_label
          (dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_> *this)

{
  dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_> *this_00;
  anon_class_8_1_ba1d6636 *in_RDI;
  
  this_00 = (dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_> *)
            std::chrono::_V2::steady_clock::now();
  dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::
  erase_if<ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::clean_expired_label()::_lambda(auto:1&)_1_>
            (this_00,in_RDI);
  return;
}

Assistant:

void clean_expired_label() override {
    erase_if([now = std::chrono::steady_clock::now()](auto& pair) mutable {
      bool r = std::chrono::duration_cast<std::chrono::seconds>(
                   now - pair.second->get_created_time())
                   .count() >= ylt_label_max_age.count();
      return r;
    });
  }